

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  sColMap *psVar1;
  short sVar2;
  int iVar3;
  sqlite3 *db;
  Table *pTVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  FKey *data;
  RenameToken *pRVar10;
  FKey *pFVar11;
  uint uVar12;
  int iVar13;
  Column *pCVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  sColMap *z;
  char *pcVar18;
  char *pcVar19;
  ulong local_a0;
  
  db = pParse->db;
  pTVar4 = pParse->pNewTable;
  if ((pTVar4 != (Table *)0x0) && (pParse->eParseMode != '\x01')) {
    if (pFromCol == (ExprList *)0x0) {
      if (0 < pTVar4->nCol) {
        uVar12 = 1;
        if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == 1)) goto LAB_0014636f;
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar4->aCol[(ushort)pTVar4->nCol - 1].zName,pTo);
      }
    }
    else if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == pFromCol->nExpr)) {
      uVar12 = pFromCol->nExpr;
LAB_0014636f:
      iVar13 = uVar12 * 0x10 + pTo->n + 0x41;
      if ((pToCol != (ExprList *)0x0) && (iVar3 = pToCol->nExpr, 0 < (long)iVar3)) {
        lVar17 = 0;
        do {
          pcVar19 = *(char **)((long)&pToCol->a[0].zName + lVar17);
          if (pcVar19 == (char *)0x0) {
            iVar7 = 1;
          }
          else {
            sVar9 = strlen(pcVar19);
            iVar7 = ((uint)sVar9 & 0x3fffffff) + 1;
          }
          iVar13 = iVar13 + iVar7;
          lVar17 = lVar17 + 0x20;
        } while ((long)iVar3 * 0x20 != lVar17);
      }
      data = (FKey *)sqlite3DbMallocZero(db,(long)iVar13);
      if (data == (FKey *)0x0) {
        data = (FKey *)0x0;
        goto LAB_00146308;
      }
      data->pFrom = pTVar4;
      data->pNextFrom = pTVar4->pFKey;
      z = data->aCol + (int)uVar12;
      data->zTo = (char *)z;
      if ((1 < pParse->eParseMode) &&
         (pRVar10 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20),
         pRVar10 != (RenameToken *)0x0)) {
        pRVar10->p = z;
        uVar8 = pTo->n;
        uVar6 = *(undefined4 *)&pTo->field_0xc;
        (pRVar10->t).z = pTo->z;
        (pRVar10->t).n = uVar8;
        *(undefined4 *)&(pRVar10->t).field_0xc = uVar6;
        pRVar10->pNext = pParse->pRename;
        pParse->pRename = pRVar10;
      }
      psVar1 = data->aCol;
      memcpy(z,pTo->z,(ulong)pTo->n);
      *(undefined1 *)((long)&z->iFrom + (ulong)pTo->n) = 0;
      sqlite3Dequote((char *)z);
      uVar8 = pTo->n;
      data->nCol = uVar12;
      if (pFromCol == (ExprList *)0x0) {
        psVar1->iFrom = pTVar4->nCol + -1;
      }
      else if (0 < (int)uVar12) {
        sVar2 = pTVar4->nCol;
        lVar17 = (long)sVar2;
        local_a0 = 0;
        do {
          if (sVar2 < 1) {
LAB_00146772:
            sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                            pFromCol->a[local_a0 & 0xffffffff].zName);
            goto LAB_00146308;
          }
          pCVar14 = pTVar4->aCol;
          pcVar19 = pFromCol->a[local_a0].zName;
          iVar13 = sqlite3StrICmp(pCVar14->zName,pcVar19);
          if (iVar13 == 0) {
            lVar15 = 0;
            bVar5 = 0 < lVar17;
          }
          else {
            lVar15 = 0;
            do {
              pCVar14 = pCVar14 + 1;
              if (lVar17 + -1 == lVar15) goto LAB_00146772;
              iVar13 = sqlite3StrICmp(pCVar14->zName,pcVar19);
              lVar15 = lVar15 + 1;
            } while (iVar13 != 0);
            bVar5 = lVar15 < lVar17;
          }
          psVar1[local_a0].iFrom = (int)lVar15;
          if (!bVar5) goto LAB_00146772;
          if ((1 < pParse->eParseMode) && (pRVar10 = pParse->pRename, pRVar10 != (RenameToken *)0x0)
             ) {
            do {
              if ((char *)pRVar10->p == pFromCol->a[local_a0].zName) {
                pRVar10->p = psVar1 + local_a0;
                break;
              }
              pRVar10 = pRVar10->pNext;
            } while (pRVar10 != (RenameToken *)0x0);
          }
          local_a0 = local_a0 + 1;
        } while (local_a0 != uVar12);
      }
      if (0 < (int)uVar12 && pToCol != (ExprList *)0x0) {
        pcVar19 = (char *)((long)&z->iFrom + (ulong)(uVar8 + 1));
        uVar16 = 0;
        do {
          pcVar18 = pToCol->a[uVar16].zName;
          uVar8 = 0;
          if (pcVar18 != (char *)0x0) {
            sVar9 = strlen(pcVar18);
            uVar8 = (uint)sVar9 & 0x3fffffff;
          }
          data->aCol[uVar16].zCol = pcVar19;
          if (1 < pParse->eParseMode) {
            for (pRVar10 = pParse->pRename; pRVar10 != (RenameToken *)0x0; pRVar10 = pRVar10->pNext)
            {
              if ((char *)pRVar10->p == pcVar18) {
                pRVar10->p = pcVar19;
                break;
              }
            }
          }
          memcpy(pcVar19,pcVar18,(ulong)uVar8);
          pcVar18 = pcVar19 + uVar8;
          pcVar19 = pcVar18 + 1;
          *pcVar18 = '\0';
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar12);
      }
      data->isDeferred = '\0';
      data->aAction[0] = (u8)flags;
      data->aAction[1] = (u8)((uint)flags >> 8);
      pFVar11 = (FKey *)sqlite3HashInsert(&pTVar4->pSchema->fkeyHash,data->zTo,data);
      if (pFVar11 == data) {
        if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
          db->mallocFailed = '\x01';
          if (0 < db->nVdbeExec) {
            (db->u1).isInterrupted = 1;
          }
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        goto LAB_00146308;
      }
      if (pFVar11 != (FKey *)0x0) {
        data->pNextTo = pFVar11;
        pFVar11->pPrevTo = data;
      }
      pTVar4->pFKey = data;
    }
    else {
      sqlite3ErrorMsg(pParse,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
    }
  }
  data = (FKey *)0x0;
LAB_00146308:
  if (data != (FKey *)0x0) {
    sqlite3DbFreeNN(db,data);
  }
  if (pFromCol != (ExprList *)0x0) {
    exprListDeleteNN(db,pFromCol);
  }
  if (pToCol == (ExprList *)0x0) {
    return;
  }
  exprListDeleteNN(db,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zName);
      }
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}